

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  ulong *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar16;
  BYTE *pBVar17;
  ulong uVar18;
  BYTE *pBVar19;
  ulong *puVar20;
  bool bVar21;
  U32 dummy32;
  BYTE *pInLoopLimit;
  uint local_c8;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_8c;
  ulong local_88;
  BYTE *local_80;
  ulong local_78;
  ulong *local_70;
  BYTE *local_68;
  BYTE *local_60;
  ulong *local_58;
  ulong *local_50;
  BYTE *local_48;
  U32 *local_40;
  ulong local_38;
  ulong uVar15;
  
  cVar8 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar4 = -0x30e4432345000000;
    break;
  case 6:
    lVar4 = -0x30e4432340650000;
    break;
  case 7:
    lVar4 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar4 = -0x30e44323485a9b9d;
    break;
  default:
    uVar6 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar8 & 0x1fU));
    goto LAB_0016ec97;
  }
  uVar6 = (ulong)(lVar4 * *(long *)ip) >> (-cVar8 & 0x3fU);
LAB_0016ec97:
  uVar10 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar3 = (ms->window).base;
  uVar14 = (int)ip - (int)pBVar3;
  uVar15 = (ulong)uVar14;
  uVar11 = uVar14 - uVar10;
  if (uVar14 < uVar10) {
    uVar11 = 0;
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x472d,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  local_40 = ms->chainTable;
  uVar7 = (ulong)ms->hashTable[uVar6];
  pBVar17 = (ms->window).dictBase;
  uVar18 = (ulong)(ms->window).dictLimit;
  uVar2 = (ms->window).lowLimit;
  uVar16 = (ms->cParams).searchLog;
  ms->hashTable[uVar6] = uVar14;
  if (uVar2 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4730,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  local_60 = pBVar17 + uVar18;
  local_68 = pBVar3 + uVar18;
  uVar6 = (ulong)((uVar14 & uVar10) * 2);
  local_b8 = local_40 + uVar6;
  local_c0 = local_40 + uVar6 + 1;
  iVar12 = 1 << ((byte)uVar16 & 0x1f);
  local_c8 = uVar14 + 9;
  local_70 = (ulong *)(iend + -7);
  local_50 = (ulong *)(iend + -3);
  local_58 = (ulong *)(iend + -1);
  local_b0 = 8;
  local_a0 = 0;
  local_a8 = 0;
  local_88 = uVar18;
  local_80 = pBVar17;
  local_78 = uVar15;
  do {
    bVar21 = iVar12 == 0;
    iVar12 = iVar12 + -1;
    if ((bVar21) || ((uint)uVar7 < uVar2)) break;
    uVar6 = local_a0;
    if (local_a8 < local_a0) {
      uVar6 = local_a8;
    }
    if ((uint)uVar15 <= (uint)uVar7) {
      __assert_fail("matchIndex < current",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4734,
                    "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                   );
    }
    uVar15 = uVar7 & 0xffffffff;
    local_38 = uVar7;
    if ((extDict == 0) || (uVar18 <= uVar6 + uVar15)) {
      if (uVar6 + uVar15 < uVar18) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x474c,
                      "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                     );
      }
      puVar1 = (ulong *)(ip + uVar6);
      puVar20 = (ulong *)(pBVar3 + uVar15 + uVar6);
      puVar13 = puVar1;
      if (puVar1 < local_70) {
        uVar7 = *puVar1 ^ *puVar20;
        uVar18 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar18 = uVar18 >> 3 & 0x1fffffff;
        if (*puVar20 == *puVar1) {
          do {
            puVar13 = puVar13 + 1;
            puVar20 = puVar20 + 1;
            if (local_70 <= puVar13) goto LAB_0016eec9;
            uVar7 = *puVar13 ^ *puVar20;
            uVar18 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = (long)puVar13 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar1);
          } while (*puVar20 == *puVar13);
        }
      }
      else {
LAB_0016eec9:
        if ((puVar13 < local_50) && ((int)*puVar20 == (int)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar13 < local_58) && ((short)*puVar20 == (short)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar13 < iend) {
          puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar20 == (char)*puVar13));
        }
        uVar18 = (long)puVar13 - (long)puVar1;
      }
      uVar6 = uVar18 + uVar6;
      pBVar19 = pBVar3 + uVar15;
    }
    else {
      local_48 = pBVar17 + uVar15;
      sVar5 = ZSTD_count_2segments(ip + uVar6,local_48 + uVar6,iend,local_60,local_68);
      uVar6 = sVar5 + uVar6;
      pBVar19 = pBVar3 + uVar15;
      if (uVar6 + uVar15 < local_88) {
        pBVar19 = local_48;
      }
    }
    uVar7 = local_38;
    uVar15 = local_78;
    pBVar17 = local_80;
    uVar18 = local_88;
    uVar16 = (uint)local_38;
    if ((local_b0 < uVar6) && (local_b0 = uVar6, local_c8 - uVar16 < uVar6)) {
      local_c8 = uVar16 + (int)uVar6;
    }
    if (ip + uVar6 == iend) {
LAB_0016eff1:
      bVar21 = false;
    }
    else {
      puVar9 = local_40 + (uVar16 & uVar10) * 2;
      if (pBVar19[uVar6] < ip[uVar6]) {
        *local_b8 = uVar16;
        local_a8 = uVar6;
        if (uVar16 <= uVar11) {
          local_b8 = &local_8c;
          goto LAB_0016eff1;
        }
        puVar9 = puVar9 + 1;
        local_b8 = puVar9;
      }
      else {
        *local_c0 = uVar16;
        local_c0 = puVar9;
        local_a0 = uVar6;
        if (uVar16 <= uVar11) {
          local_c0 = &local_8c;
          goto LAB_0016eff1;
        }
      }
      uVar7 = (ulong)*puVar9;
      bVar21 = true;
    }
  } while (bVar21);
  *local_c0 = 0;
  *local_b8 = 0;
  uVar10 = local_c8 - (uVar14 + 8);
  if (uVar14 + 8 <= local_c8 && uVar10 != 0) {
    uVar14 = (int)local_b0 - 0x180;
    uVar11 = 0xc0;
    if (uVar14 < 0xc0) {
      uVar11 = uVar14;
    }
    uVar14 = 0;
    if (0x180 < local_b0) {
      uVar14 = uVar11;
    }
    if (uVar14 <= uVar10) {
      uVar14 = uVar10;
    }
    return uVar14;
  }
  __assert_fail("matchEndIdx > current + 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4773,
                "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
               );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > current + 8);
        return MAX(positions, matchEndIdx - (current + 8));
    }
}